

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

CoinsResult * __thiscall
wallet::AvailableCoins
          (CoinsResult *__return_storage_ptr__,wallet *this,CWallet *wallet,
          CCoinControl *coinControl,optional<CFeeRate> feerate,CoinFilterParams *params)

{
  _Rb_tree_header *p_Var1;
  CWalletTx *wtx;
  CTxOut *txout;
  long lVar2;
  pointer __src;
  COutput *pCVar3;
  uchar *puVar4;
  COutPoint outpoint_00;
  optional<CFeeRate> feerate_00;
  byte bVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  int depth;
  isminetype iVar12;
  int input_bytes;
  TxoutType TVar13;
  uint uVar14;
  const_iterator cVar15;
  ulong uVar16;
  int64_t time;
  size_t sVar17;
  mapped_type_conflict1 *pmVar18;
  _Base_ptr p_Var19;
  ulong uVar20;
  uint uVar21;
  long *plVar22;
  OutputType type;
  int iVar23;
  bool bVar24;
  long *plVar25;
  COutput *output;
  long lVar26;
  COutput *this_00;
  long in_FS_OFFSET;
  bool bVar27;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  script_solutions;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> provider;
  vector<COutPoint,_std::allocator<COutPoint>_> outpoints;
  CScript script;
  COutPoint outpoint;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  int local_274;
  int local_270;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_238;
  undefined1 local_220 [8];
  Notifications local_218;
  iterator iStack_210;
  COutPoint *local_208;
  _Storage<CFeeRate,_true> local_1f8;
  char cStack_1f0;
  undefined7 uStack_1ef;
  undefined1 local_1e8 [28];
  uint uStack_1cc;
  direct_or_indirect local_198;
  uint local_17c;
  uchar local_13c [4];
  uchar auStack_138 [4];
  uchar auStack_134 [4];
  uchar auStack_130 [4];
  int local_12c;
  uchar local_128 [4];
  uchar auStack_124 [4];
  uchar auStack_120 [4];
  uchar auStack_11c [4];
  int local_118;
  _Rb_tree_node_base local_108;
  undefined4 local_e8;
  undefined1 local_d8 [24];
  _Base_ptr p_Stack_c0;
  uint32_t local_b8;
  key_type local_a8;
  key_type local_88;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_68;
  undefined8 local_38;
  
  plVar22 = feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cStack_1f0 = feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
               super__Optional_payload_base<CFeeRate>._M_payload._0_1_;
  p_Var1 = &(__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->total_amount = 0;
  (__return_storage_ptr__->total_effective_amount).super__Optional_base<long,_true,_true>._M_payload
  .super__Optional_payload_base<long>._M_payload._M_value = 0;
  (__return_storage_ptr__->total_effective_amount).super__Optional_base<long,_true,_true>._M_payload
  .super__Optional_payload_base<long>._M_engaged = true;
  local_1f8 = (_Storage<CFeeRate,_true>)coinControl;
  bVar8 = CWallet::IsWalletFlagSet((CWallet *)this,1);
  bVar9 = 1;
  if (bVar8) {
    if (wallet == (CWallet *)0x0) {
      bVar9 = 0;
    }
    else {
      bVar9 = *(byte *)((long)&(wallet->mapTxSpends)._M_h._M_buckets + 3) ^ 1;
    }
  }
  if (wallet == (CWallet *)0x0) {
    local_270 = 0;
    local_274 = 9999999;
    bVar5 = 0;
  }
  else {
    local_270 = (int)(wallet->mapTxSpends)._M_h._M_bucket_count;
    local_274 = *(int *)((long)&(wallet->mapTxSpends)._M_h._M_bucket_count + 4);
    bVar5 = (byte)(wallet->m_best_block_time).super___atomic_base<long>._M_i;
  }
  bVar8 = CWallet::CanGrindR((CWallet *)this);
  local_218._vptr_Notifications = (_func_int **)0x0;
  iStack_210._M_current = (COutPoint *)0x0;
  local_208 = (COutPoint *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar25 = *(long **)(this + 0x268);
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (plVar25 == (long *)0x0) {
    bVar8 = true;
    bVar24 = false;
  }
  else {
    bVar24 = false;
    do {
      wtx = (CWalletTx *)(plVar25 + 5);
      bVar10 = CWallet::IsTxImmatureCoinBase((CWallet *)this,wtx);
      if ((!bVar10) || (iVar23 = 3, *(char *)((long)plVar22 + 0x21) != '\0')) {
        depth = CWallet::GetTxDepthInMainChain((CWallet *)this,wtx);
        iVar23 = 3;
        if ((-1 < depth) && ((depth != 0 || (bVar10 = CWalletTx::InMempool(wtx), bVar10)))) {
          bVar11 = CachedTxIsTrusted((CWallet *)this,wtx,
                                     (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                                     &local_68);
          bVar10 = true;
          if (depth == 0) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"replaces_txid","");
            cVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)wtx,&local_88);
            bVar10 = cVar15._M_node == (_Base_ptr)(plVar25 + 6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          bVar27 = true;
          if (depth == 0) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"replaced_by_txid","");
            cVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)wtx,&local_a8);
            bVar27 = cVar15._M_node == (_Base_ptr)(plVar25 + 6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
          }
          bVar27 = (bool)(bVar27 & bVar11 & bVar10);
          if ((bVar5 & 1) == 0 && bVar27 == false) {
            iVar23 = 3;
          }
          else {
            iVar23 = 3;
            if ((local_270 <= depth) && (depth <= local_274)) {
              local_1e8._0_4_ = 3;
              bVar10 = CachedTxIsFromMe((CWallet *)this,wtx,(isminefilter *)local_1e8);
              lVar26 = *(long *)(plVar25[0x38] + 0x18);
              if (*(long *)(plVar25[0x38] + 0x20) != lVar26) {
                uVar21 = 1;
                uVar16 = 0;
                do {
                  local_b8 = uVar21 - 1;
                  local_d8._0_4_ = *(undefined4 *)(plVar25 + 1);
                  puVar4 = (uchar *)((long)plVar25 + 0xc);
                  local_d8[4] = puVar4[0];
                  local_d8[5] = puVar4[1];
                  local_d8[6] = puVar4[2];
                  local_d8[7] = puVar4[3];
                  local_d8._8_4_ = *(undefined4 *)(plVar25 + 2);
                  local_d8._12_4_ = *(undefined4 *)((long)plVar25 + 0x14);
                  local_d8._16_8_ = plVar25[3];
                  p_Stack_c0 = (_Base_ptr)plVar25[4];
                  lVar2 = *(long *)(lVar26 + uVar16 * 0x28);
                  iVar23 = 6;
                  if (((((*plVar22 <= lVar2) && (lVar2 <= plVar22[1])) &&
                       ((wallet == (CWallet *)0x0 ||
                        ((bVar11 = CCoinControl::HasSelected((CCoinControl *)wallet), !bVar11 ||
                         (bVar11 = CCoinControl::IsSelected
                                             ((CCoinControl *)wallet,(COutPoint *)local_d8), !bVar11
                         )))))) &&
                      ((bVar11 = CWallet::IsLockedCoin((CWallet *)this,(COutPoint *)local_d8),
                       !bVar11 || (*(char *)((long)plVar22 + 0x22) == '\0')))) &&
                     (bVar11 = CWallet::IsSpent((CWallet *)this,(COutPoint *)local_d8), !bVar11)) {
                    txout = (CTxOut *)(lVar26 + uVar16 * 0x28);
                    iVar12 = CWallet::IsMine((CWallet *)this,txout);
                    if ((iVar12 != ISMINE_NO) &&
                       ((bVar9 != 0 ||
                        (bVar11 = CWallet::IsSpentKey((CWallet *)this,&txout->scriptPubKey), !bVar11
                        )))) {
                      CWallet::GetSolvingProvider((CWallet *)local_220,(CScript *)this);
                      local_108._M_left = (_Base_ptr)0x0;
                      local_108._M_right = (_Base_ptr)0x0;
                      local_108._M_color = _S_red;
                      local_108._4_4_ = 0;
                      local_108._M_parent = (_Base_ptr)0x0;
                      local_e8 = 0xffffffff;
                      outpoint_00.n = 0xffffffff;
                      outpoint_00.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
                           (uint256)(uint256)ZEXT832(0);
                      input_bytes = CalculateMaximumSignedInputSize
                                              (txout,outpoint_00,(SigningProvider *)local_220,bVar8,
                                               (CCoinControl *)wallet);
                      bVar11 = true;
                      if (((iVar12 & ISMINE_SPENDABLE) == ISMINE_NO) &&
                         ((bVar11 = false, wallet != (CWallet *)0x0 &&
                          ((iVar12 & ISMINE_WATCH_ONLY) != ISMINE_NO)))) {
                        bVar11 = (bool)(-1 < input_bytes &
                                       *(byte *)((long)&(wallet->m_best_block_time).
                                                        super___atomic_base<long>._M_i + 2));
                      }
                      if ((bVar11 != false) || (iVar23 = 6, (char)plVar22[4] == '\0')) {
                        local_238.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_238.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_238.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        TVar13 = Solver(&txout->scriptPubKey,&local_238);
                        auVar6 = local_220;
                        if (TVar13 == SCRIPTHASH && -1 < input_bytes) {
                          local_1e8._16_8_ = 0;
                          stack0xfffffffffffffe30 = (_Base_ptr)0x0;
                          local_1e8._0_8_ = 0.0;
                          local_1e8._8_8_ = 0;
                          __src = ((local_238.
                                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start;
                          if ((long)((local_238.
                                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)__src !=
                              0x14) {
                            __assert_fail("vch.size() == WIDTH",
                                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                                          ,0x2a,
                                          "base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]"
                                         );
                          }
                          memcpy(local_13c,__src,0x14);
                          local_128[0] = local_13c[0];
                          local_128[1] = local_13c[1];
                          local_128[2] = local_13c[2];
                          local_128[3] = local_13c[3];
                          auStack_124[0] = auStack_138[0];
                          auStack_124[1] = auStack_138[1];
                          auStack_124[2] = auStack_138[2];
                          auStack_124[3] = auStack_138[3];
                          auStack_120[0] = auStack_134[0];
                          auStack_120[1] = auStack_134[1];
                          auStack_120[2] = auStack_134[2];
                          auStack_120[3] = auStack_134[3];
                          auStack_11c[0] = auStack_130[0];
                          auStack_11c[1] = auStack_130[1];
                          auStack_11c[2] = auStack_130[2];
                          auStack_11c[3] = auStack_130[3];
                          local_118 = local_12c;
                          uVar14 = (*(*(_func_int ***)auVar6)[2])(auVar6,local_128,local_1e8);
                          if ((char)uVar14 == '\0') {
                            iVar23 = 6;
                            TVar13 = SCRIPTHASH;
                          }
                          else {
                            TVar13 = Solver((CScript *)local_1e8,&local_238);
                            iVar23 = 0;
                          }
                          if (0x1c < uStack_1cc) {
                            free((void *)local_1e8._0_8_);
                            local_1e8._0_8_ = 0.0;
                          }
                          bVar7 = bVar24;
                          if ((char)uVar14 != '\0') goto LAB_0051599f;
                        }
                        else {
                          uVar14 = 0;
LAB_0051599f:
                          if (TVar13 - PUBKEYHASH < 2) {
                            type = LEGACY;
                          }
                          else if (TVar13 - WITNESS_V0_SCRIPTHASH < 2) {
                            type = BECH32 - (uVar14 & 0xff);
                          }
                          else {
                            type = BECH32M;
                            if (TVar13 != WITNESS_V1_TAPROOT) {
                              type = UNKNOWN;
                            }
                          }
                          time = CWalletTx::GetTxTime(wtx);
                          feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                          super__Optional_payload_base<CFeeRate>._9_7_ = uStack_1ef;
                          feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                          super__Optional_payload_base<CFeeRate>._M_engaged = (bool)cStack_1f0;
                          feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                          super__Optional_payload_base<CFeeRate>._M_payload = local_1f8;
                          COutput::COutput((COutput *)local_1e8,(COutPoint *)local_d8,txout,depth,
                                           input_bytes,bVar11,
                                           (bool)((byte)~(byte)((uint)input_bytes >> 0x18) >> 7),
                                           bVar27,time,bVar10,feerate_00);
                          CoinsResult::Add(__return_storage_ptr__,type,(COutput *)local_1e8);
                          if (0x1c < local_17c) {
                            free(local_198.indirect_contents.indirect);
                            local_198.indirect_contents.indirect = (char *)0x0;
                          }
                          if (iStack_210._M_current == local_208) {
                            std::vector<COutPoint,std::allocator<COutPoint>>::
                            _M_realloc_insert<COutPoint_const&>
                                      ((vector<COutPoint,std::allocator<COutPoint>> *)&local_218,
                                       iStack_210,(COutPoint *)local_d8);
                          }
                          else {
                            (iStack_210._M_current)->n = local_b8;
                            *(undefined8 *)
                             (((iStack_210._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data
                              ._M_elems + 0x10) = local_d8._16_8_;
                            *(_Base_ptr *)
                             (((iStack_210._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data
                              ._M_elems + 0x18) = p_Stack_c0;
                            *(ulong *)((iStack_210._M_current)->hash).m_wrapped.
                                      super_base_blob<256U>.m_data._M_elems =
                                 CONCAT44(local_d8._4_4_,local_d8._0_4_);
                            *(ulong *)(((iStack_210._M_current)->hash).m_wrapped.
                                       super_base_blob<256U>.m_data._M_elems + 8) =
                                 CONCAT44(local_d8._12_4_,local_d8._8_4_);
                            iStack_210._M_current = iStack_210._M_current + 1;
                          }
                          iVar23 = 1;
                          bVar7 = true;
                          if (((plVar22[2] == 2100000000000000) ||
                              (__return_storage_ptr__->total_amount < plVar22[2])) &&
                             ((uVar16 = plVar22[3], uVar16 == 0 ||
                              (sVar17 = CoinsResult::Size(__return_storage_ptr__), sVar17 < uVar16))
                             )) {
                            iVar23 = 0;
                            bVar7 = bVar24;
                          }
                        }
                        bVar24 = bVar7;
                        std::
                        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::~vector(&local_238);
                      }
                      if (local_220 != (undefined1  [8])0x0) {
                        (*(*(_func_int ***)local_220)[1])();
                      }
                    }
                  }
                  if ((iVar23 != 6) && (iVar23 != 0)) goto LAB_00515b94;
                  uVar16 = (ulong)uVar21;
                  lVar26 = *(long *)(plVar25[0x38] + 0x18);
                  uVar20 = (*(long *)(plVar25[0x38] + 0x20) - lVar26 >> 3) * -0x3333333333333333;
                  uVar21 = uVar21 + 1;
                } while (uVar16 <= uVar20 && uVar20 - uVar16 != 0);
              }
              iVar23 = 4;
LAB_00515b94:
              if (iVar23 == 4) {
                iVar23 = 0;
              }
            }
          }
        }
      }
      if ((iVar23 != 3) && (iVar23 != 0)) goto LAB_00515bbe;
      plVar25 = (long *)*plVar25;
    } while (plVar25 != (long *)0x0);
    iVar23 = 2;
LAB_00515bbe:
    bVar8 = iVar23 == 2;
  }
  if (bVar8) {
    if (cStack_1f0 == '\x01') {
      plVar22 = *(long **)(this + 0xb8);
      if (plVar22 == (long *)0x0) {
        __assert_fail("m_chain",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                      ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
      }
      (**(code **)(*plVar22 + 0xb8))(local_1e8,plVar22,&local_218,&local_1f8);
      p_Var19 = (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      if ((_Rb_tree_header *)p_Var19 != p_Var1) {
        do {
          pCVar3 = (COutput *)p_Var19[1]._M_left;
          for (this_00 = (COutput *)p_Var19[1]._M_parent; this_00 != pCVar3; this_00 = this_00 + 1)
          {
            pmVar18 = std::
                      map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      ::at((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                            *)local_1e8,&this_00->outpoint);
            COutput::ApplyBumpFee(this_00,*pmVar18);
          }
          p_Var19 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var19);
        } while ((_Rb_tree_header *)p_Var19 != p_Var1);
      }
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)local_1e8);
    }
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&local_68);
    if (local_218._vptr_Notifications != (_func_int **)0x0) {
      operator_delete(local_218._vptr_Notifications,
                      (long)local_208 - (long)local_218._vptr_Notifications);
    }
  }
  else {
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&local_68);
    if (local_218._vptr_Notifications != (_func_int **)0x0) {
      operator_delete(local_218._vptr_Notifications,
                      (long)local_208 - (long)local_218._vptr_Notifications);
    }
    if (!bVar24) {
      _GLOBAL__N_1::std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                   *)__return_storage_ptr__);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CoinsResult AvailableCoins(const CWallet& wallet,
                           const CCoinControl* coinControl,
                           std::optional<CFeeRate> feerate,
                           const CoinFilterParams& params)
{
    AssertLockHeld(wallet.cs_wallet);

    CoinsResult result;
    // Either the WALLET_FLAG_AVOID_REUSE flag is not set (in which case we always allow), or we default to avoiding, and only in the case where
    // a coin control object is provided, and has the avoid address reuse flag set to false, do we allow already used addresses
    bool allow_used_addresses = !wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE) || (coinControl && !coinControl->m_avoid_address_reuse);
    const int min_depth = {coinControl ? coinControl->m_min_depth : DEFAULT_MIN_DEPTH};
    const int max_depth = {coinControl ? coinControl->m_max_depth : DEFAULT_MAX_DEPTH};
    const bool only_safe = {coinControl ? !coinControl->m_include_unsafe_inputs : true};
    const bool can_grind_r = wallet.CanGrindR();
    std::vector<COutPoint> outpoints;

    std::set<uint256> trusted_parents;
    for (const auto& entry : wallet.mapWallet)
    {
        const uint256& txid = entry.first;
        const CWalletTx& wtx = entry.second;

        if (wallet.IsTxImmatureCoinBase(wtx) && !params.include_immature_coinbase)
            continue;

        int nDepth = wallet.GetTxDepthInMainChain(wtx);
        if (nDepth < 0)
            continue;

        // We should not consider coins which aren't at least in our mempool
        // It's possible for these to be conflicted via ancestors which we may never be able to detect
        if (nDepth == 0 && !wtx.InMempool())
            continue;

        bool safeTx = CachedTxIsTrusted(wallet, wtx, trusted_parents);

        // We should not consider coins from transactions that are replacing
        // other transactions.
        //
        // Example: There is a transaction A which is replaced by bumpfee
        // transaction B. In this case, we want to prevent creation of
        // a transaction B' which spends an output of B.
        //
        // Reason: If transaction A were initially confirmed, transactions B
        // and B' would no longer be valid, so the user would have to create
        // a new transaction C to replace B'. However, in the case of a
        // one-block reorg, transactions B' and C might BOTH be accepted,
        // when the user only wanted one of them. Specifically, there could
        // be a 1-block reorg away from the chain where transactions A and C
        // were accepted to another chain where B, B', and C were all
        // accepted.
        if (nDepth == 0 && wtx.mapValue.count("replaces_txid")) {
            safeTx = false;
        }

        // Similarly, we should not consider coins from transactions that
        // have been replaced. In the example above, we would want to prevent
        // creation of a transaction A' spending an output of A, because if
        // transaction B were initially confirmed, conflicting with A and
        // A', we wouldn't want to the user to create a transaction D
        // intending to replace A', but potentially resulting in a scenario
        // where A, A', and D could all be accepted (instead of just B and
        // D, or just A and A' like the user would want).
        if (nDepth == 0 && wtx.mapValue.count("replaced_by_txid")) {
            safeTx = false;
        }

        if (only_safe && !safeTx) {
            continue;
        }

        if (nDepth < min_depth || nDepth > max_depth) {
            continue;
        }

        bool tx_from_me = CachedTxIsFromMe(wallet, wtx, ISMINE_ALL);

        for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
            const CTxOut& output = wtx.tx->vout[i];
            const COutPoint outpoint(Txid::FromUint256(txid), i);

            if (output.nValue < params.min_amount || output.nValue > params.max_amount)
                continue;

            // Skip manually selected coins (the caller can fetch them directly)
            if (coinControl && coinControl->HasSelected() && coinControl->IsSelected(outpoint))
                continue;

            if (wallet.IsLockedCoin(outpoint) && params.skip_locked)
                continue;

            if (wallet.IsSpent(outpoint))
                continue;

            isminetype mine = wallet.IsMine(output);

            if (mine == ISMINE_NO) {
                continue;
            }

            if (!allow_used_addresses && wallet.IsSpentKey(output.scriptPubKey)) {
                continue;
            }

            std::unique_ptr<SigningProvider> provider = wallet.GetSolvingProvider(output.scriptPubKey);

            int input_bytes = CalculateMaximumSignedInputSize(output, COutPoint(), provider.get(), can_grind_r, coinControl);
            // Because CalculateMaximumSignedInputSize infers a solvable descriptor to get the satisfaction size,
            // it is safe to assume that this input is solvable if input_bytes is greater than -1.
            bool solvable = input_bytes > -1;
            bool spendable = ((mine & ISMINE_SPENDABLE) != ISMINE_NO) || (((mine & ISMINE_WATCH_ONLY) != ISMINE_NO) && (coinControl && coinControl->fAllowWatchOnly && solvable));

            // Filter by spendable outputs only
            if (!spendable && params.only_spendable) continue;

            // Obtain script type
            std::vector<std::vector<uint8_t>> script_solutions;
            TxoutType type = Solver(output.scriptPubKey, script_solutions);

            // If the output is P2SH and solvable, we want to know if it is
            // a P2SH (legacy) or one of P2SH-P2WPKH, P2SH-P2WSH (P2SH-Segwit). We can determine
            // this from the redeemScript. If the output is not solvable, it will be classified
            // as a P2SH (legacy), since we have no way of knowing otherwise without the redeemScript
            bool is_from_p2sh{false};
            if (type == TxoutType::SCRIPTHASH && solvable) {
                CScript script;
                if (!provider->GetCScript(CScriptID(uint160(script_solutions[0])), script)) continue;
                type = Solver(script, script_solutions);
                is_from_p2sh = true;
            }

            result.Add(GetOutputType(type, is_from_p2sh),
                       COutput(outpoint, output, nDepth, input_bytes, spendable, solvable, safeTx, wtx.GetTxTime(), tx_from_me, feerate));

            outpoints.push_back(outpoint);

            // Checks the sum amount of all UTXO's.
            if (params.min_sum_amount != MAX_MONEY) {
                if (result.GetTotalAmount() >= params.min_sum_amount) {
                    return result;
                }
            }

            // Checks the maximum number of UTXO's.
            if (params.max_count > 0 && result.Size() >= params.max_count) {
                return result;
            }
        }
    }

    if (feerate.has_value()) {
        std::map<COutPoint, CAmount> map_of_bump_fees = wallet.chain().calculateIndividualBumpFees(outpoints, feerate.value());

        for (auto& [_, outputs] : result.coins) {
            for (auto& output : outputs) {
                output.ApplyBumpFee(map_of_bump_fees.at(output.outpoint));
            }
        }
    }

    return result;
}